

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemViewPrivate::scrollerStateChanged(QAbstractItemViewPrivate *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  State SVar6;
  QAbstractItemViewPrivate *d;
  QScroller *this_00;
  long in_FS_OFFSET;
  Data *local_68;
  QItemSelectionRange *in_stack_ffffffffffffffa0;
  QArrayDataPointer<QItemSelectionRange> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                    super_QWidgetPrivate.field_0x8;
  this_00 = QScroller::scroller((QObject *)in_stack_ffffffffffffffa0);
  if (this_00 != (QScroller *)0x0) {
    SVar6 = QScroller::state(this_00);
    if (SVar6 == Dragging) {
      lVar3 = *(long *)(lVar2 + 8);
      lVar4 = *(long *)(lVar3 + 800);
      if (((lVar4 != 0) && (*(int *)(lVar4 + 4) != 0)) && (*(long *)(lVar3 + 0x328) != 0)) {
        (**(code **)(**(long **)(lVar3 + 0x328) + 0x70))
                  (*(long **)(lVar3 + 0x328),&this->oldSelection,3,*(undefined4 *)(lVar4 + 4));
        bVar1 = this->autoScroll;
        this->autoScroll = false;
        plVar5 = *(long **)(*(long *)(lVar2 + 8) + 0x328);
        (**(code **)(*plVar5 + 0x60))
                  (plVar5,&this->oldCurrent,0,
                   *(undefined4 *)(*(long *)(*(long *)(lVar2 + 8) + 800) + 4));
        this->autoScroll = bVar1;
      }
    }
    else if (SVar6 == Pressed) {
      lVar3 = *(long *)(*(long *)(lVar2 + 8) + 800);
      if (((lVar3 != 0) && (*(int *)(lVar3 + 4) != 0)) &&
         (*(long *)(*(long *)(lVar2 + 8) + 0x328) != 0)) {
        QItemSelectionModel::selection();
        QArrayDataPointer<QItemSelectionRange>::operator=
                  ((QArrayDataPointer<QItemSelectionRange> *)&this->oldSelection,&local_48);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_48);
        QItemSelectionModel::currentIndex();
        (this->oldCurrent).m.ptr = (QAbstractItemModel *)local_48.size;
        *(Data **)&this->oldCurrent = local_48.d;
        (this->oldCurrent).i = (quintptr)local_48.ptr;
      }
      goto LAB_005395bb;
    }
    local_68 = (Data *)0x0;
    local_48.d = (this->oldSelection).super_QList<QItemSelectionRange>.d.d;
    local_48.ptr = (this->oldSelection).super_QList<QItemSelectionRange>.d.ptr;
    (this->oldSelection).super_QList<QItemSelectionRange>.d.d = (Data *)0x0;
    (this->oldSelection).super_QList<QItemSelectionRange>.d.ptr = (QItemSelectionRange *)0x0;
    local_48.size = (this->oldSelection).super_QList<QItemSelectionRange>.d.size;
    (this->oldSelection).super_QList<QItemSelectionRange>.d.size = 0;
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_68);
    (this->oldCurrent).r = -1;
    (this->oldCurrent).c = -1;
    (this->oldCurrent).i = 0;
    (this->oldCurrent).m.ptr = (QAbstractItemModel *)0x0;
  }
LAB_005395bb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::scrollerStateChanged()
{
    Q_Q(QAbstractItemView);

    if (QScroller *scroller = QScroller::scroller(viewport)) {
        switch (scroller->state()) {
        case QScroller::Pressed:
            // store the current selection in case we start scrolling
            if (q->selectionModel()) {
                oldSelection = q->selectionModel()->selection();
                oldCurrent = q->selectionModel()->currentIndex();
            }
            break;

        case QScroller::Dragging:
            // restore the old selection if we really start scrolling
            if (q->selectionModel()) {
                q->selectionModel()->select(oldSelection, QItemSelectionModel::ClearAndSelect);
                // block autoScroll logic while we are already handling scrolling
                const bool wasAutoScroll = autoScroll;
                autoScroll = false;
                q->selectionModel()->setCurrentIndex(oldCurrent, QItemSelectionModel::NoUpdate);
                autoScroll = wasAutoScroll;
            }
            Q_FALLTHROUGH();

        default:
            oldSelection = QItemSelection();
            oldCurrent = QModelIndex();
            break;
        }
    }
}